

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void Service_AddNodes_single
               (UA_Server *server,UA_Session *session,UA_AddNodesItem *item,
               UA_AddNodesResult *result,UA_InstantiationCallback *instantiationCallback)

{
  UA_Node *node;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ushort uVar9;
  ushort uVar10;
  UA_NodeClass UVar11;
  uint uVar12;
  UA_VariableAttributes *attr;
  UA_SecureChannel *pUVar13;
  UA_StatusCode UVar14;
  uint uVar15;
  UA_NodeStoreEntry *pUVar16;
  UA_DataType *pUVar17;
  long lVar18;
  ulong uVar19;
  UA_Logger logger;
  ulong uVar20;
  long lVar21;
  undefined8 uVar22;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  uVar15 = 0x80620000;
  if ((UA_EXTENSIONOBJECT_ENCODED_XML < (item->nodeAttributes).encoding) &&
     ((item->nodeAttributes).content.decoded.type != (UA_DataType *)0x0)) {
    pUVar16 = instantiateEntry(item->nodeClass);
    if (pUVar16 == (UA_NodeStoreEntry *)0x0) {
      uVar15 = 0x80030000;
    }
    else {
      node = &pUVar16->node;
      attr = (UA_VariableAttributes *)(item->nodeAttributes).content.decoded.data;
      UVar14 = copyStandardAttributes(node,item,(UA_NodeAttributes *)attr);
      UVar11 = item->nodeClass;
      uVar15 = 0x805f0000;
      if ((int)UVar11 < 0x10) {
        if (UVar11 == UA_NODECLASS_OBJECT) {
          pUVar17 = (UA_DataType *)0x13f7c0;
LAB_001213ca:
          uVar15 = 0x80620000;
          if ((item->nodeAttributes).content.decoded.type == pUVar17) {
            *(undefined1 *)&pUVar16[1].orig = *(undefined1 *)&(attr->value).type;
            uVar15 = UVar14;
            goto LAB_00121454;
          }
        }
        else if (UVar11 == UA_NODECLASS_VARIABLE) {
          uVar15 = 0x80620000;
          if ((item->nodeAttributes).content.decoded.type == (UA_DataType *)0x13e9e0) {
            pUVar16[2].node.nodeId.identifier.guid.data4[0] = attr->accessLevel;
            pUVar16[2].node.nodeId.identifier.guid.data4[1] = attr->userAccessLevel;
            *(UA_Boolean *)&pUVar16[2].node.browseName.namespaceIndex = attr->historizing;
            *(UA_Double *)&pUVar16[2].node.nodeClass = attr->minimumSamplingInterval;
            goto LAB_0012143c;
          }
        }
        else if (UVar11 == UA_NODECLASS_OBJECTTYPE) {
          pUVar17 = (UA_DataType *)0x13eec0;
          goto LAB_001213ca;
        }
      }
      else if ((int)UVar11 < 0x40) {
        if (UVar11 == UA_NODECLASS_VARIABLETYPE) {
          uVar15 = 0x80620000;
          if ((item->nodeAttributes).content.decoded.type == (UA_DataType *)0x13f550) {
            pUVar16[2].node.nodeId.identifier.guid.data4[0] = attr->accessLevel;
LAB_0012143c:
            uVar15 = copyCommonVariableAttributes(server,(UA_VariableNode *)node,item,attr);
            goto LAB_0012144e;
          }
        }
        else if ((UVar11 == UA_NODECLASS_REFERENCETYPE) &&
                (uVar15 = 0x80620000,
                (item->nodeAttributes).content.decoded.type == (UA_DataType *)0x13f700)) {
          *(undefined1 *)&pUVar16[1].orig = *(undefined1 *)&(attr->value).type;
          *(undefined1 *)((long)&pUVar16[1].orig + 1) =
               *(undefined1 *)((long)&(attr->value).type + 1);
          uVar15 = UA_copy(&(attr->value).storageType,&pUVar16[1].node,UA_TYPES + 0x14);
LAB_0012144e:
          uVar15 = UVar14 | uVar15;
          goto LAB_00121454;
        }
      }
      else {
        if (UVar11 == UA_NODECLASS_DATATYPE) {
          pUVar17 = (UA_DataType *)0x13f0d0;
          goto LAB_001213ca;
        }
        if ((UVar11 != UA_NODECLASS_VIEW) ||
           (uVar15 = 0x80620000,
           (item->nodeAttributes).content.decoded.type != (UA_DataType *)0x13e8c0))
        goto LAB_00121460;
        uVar9 = *(ushort *)&(attr->value).type;
        *(ushort *)&pUVar16[1].orig = uVar9 << 8 | uVar9 >> 8;
        uVar15 = UVar14;
LAB_00121454:
        if (uVar15 == 0) {
          result->statusCode = 0;
          UVar14 = Service_AddNodes_existing
                             (server,session,node,(UA_NodeId *)item,&item->referenceTypeId,
                              &(item->typeDefinition).nodeId,instantiationCallback,
                              &result->addedNodeId);
          result->statusCode = UVar14;
          if (UVar14 == 0) {
            return;
          }
          pUVar13 = session->channel;
          if (pUVar13 == (UA_SecureChannel *)0x0) {
            uVar19 = 0;
            uVar20 = 0;
          }
          else {
            if (pUVar13->connection == (UA_Connection *)0x0) {
              uVar19 = 0;
            }
            else {
              uVar19 = (ulong)(uint)pUVar13->connection->sockfd;
            }
            uVar20 = (ulong)(pUVar13->securityToken).channelId;
          }
          logger = (server->config).logger;
          uVar12 = (session->sessionId).identifier.numeric;
          uVar9 = (session->sessionId).identifier.guid.data2;
          uVar10 = (session->sessionId).identifier.guid.data3;
          bVar1 = (session->sessionId).identifier.guid.data4[0];
          bVar2 = (session->sessionId).identifier.guid.data4[1];
          bVar3 = (session->sessionId).identifier.guid.data4[2];
          bVar4 = (session->sessionId).identifier.guid.data4[3];
          bVar5 = (session->sessionId).identifier.guid.data4[4];
          bVar6 = (session->sessionId).identifier.guid.data4[5];
          bVar7 = (session->sessionId).identifier.guid.data4[6];
          bVar8 = (session->sessionId).identifier.guid.data4[7];
          lVar18 = 0;
          lVar21 = 0x141ba0;
          do {
            if (*(UA_StatusCode *)((long)&statusCodeDescriptions[0].code + lVar18) == UVar14) {
              lVar21 = (long)&statusCodeDescriptions[0].code + lVar18;
              break;
            }
            lVar18 = lVar18 + 0x18;
          } while (lVar18 != 0x1578);
          uVar22 = *(undefined8 *)(lVar21 + 8);
          goto LAB_0012154e;
        }
      }
LAB_00121460:
      UA_NodeStore_deleteNode(node);
    }
  }
  result->statusCode = uVar15;
  pUVar13 = session->channel;
  if (pUVar13 == (UA_SecureChannel *)0x0) {
    uVar19 = 0;
    uVar20 = 0;
  }
  else {
    if (pUVar13->connection == (UA_Connection *)0x0) {
      uVar19 = 0;
    }
    else {
      uVar19 = (ulong)(uint)pUVar13->connection->sockfd;
    }
    uVar20 = (ulong)(pUVar13->securityToken).channelId;
  }
  logger = (server->config).logger;
  uVar12 = (session->sessionId).identifier.numeric;
  uVar9 = (session->sessionId).identifier.guid.data2;
  uVar10 = (session->sessionId).identifier.guid.data3;
  bVar1 = (session->sessionId).identifier.guid.data4[0];
  bVar2 = (session->sessionId).identifier.guid.data4[1];
  bVar3 = (session->sessionId).identifier.guid.data4[2];
  bVar4 = (session->sessionId).identifier.guid.data4[3];
  bVar5 = (session->sessionId).identifier.guid.data4[4];
  bVar6 = (session->sessionId).identifier.guid.data4[5];
  bVar7 = (session->sessionId).identifier.guid.data4[6];
  bVar8 = (session->sessionId).identifier.guid.data4[7];
  lVar18 = 0;
  lVar21 = 0x141ba0;
  do {
    if (*(UA_StatusCode *)((long)&statusCodeDescriptions[0].code + lVar18) == uVar15) {
      lVar21 = (long)&statusCodeDescriptions[0].code + lVar18;
      break;
    }
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x1578);
  uVar22 = *(undefined8 *)(lVar21 + 8);
LAB_0012154e:
  local_38 = (ulong)bVar2;
  local_40 = (ulong)bVar1;
  local_48 = (ulong)uVar9;
  local_50 = (ulong)uVar10;
  UA_LOG_INFO(logger,UA_LOGCATEGORY_SESSION,
              "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Could not add node with error code %s"
              ,uVar19,uVar20,(ulong)uVar12,local_48,local_50,local_40,local_38,(ulong)bVar3,
              (ulong)bVar4,(ulong)bVar5,(ulong)bVar6,(ulong)bVar7,(ulong)bVar8,uVar22);
  return;
}

Assistant:

static void
Service_AddNodes_single(UA_Server *server, UA_Session *session,
                        const UA_AddNodesItem *item, UA_AddNodesResult *result,
                        UA_InstantiationCallback *instantiationCallback) {
    /* Create the node from the attributes*/
    UA_Node *node = NULL;
    result->statusCode = createNodeFromAttributes(server, item, &node);
    if(result->statusCode != UA_STATUSCODE_GOOD) {
        UA_LOG_INFO_SESSION(server->config.logger, session,
                            "Could not add node with error code %s",
                            UA_StatusCode_name(result->statusCode));
        return;
    }

    /* Run consistency checks and add the node */
    UA_assert(node != NULL);
    result->statusCode = Service_AddNodes_existing(server, session, node, &item->parentNodeId.nodeId,
                                                   &item->referenceTypeId, &item->typeDefinition.nodeId,
                                                   instantiationCallback, &result->addedNodeId);
    if(result->statusCode != UA_STATUSCODE_GOOD) {
        UA_LOG_INFO_SESSION(server->config.logger, session,
                            "Could not add node with error code %s",
                            UA_StatusCode_name(result->statusCode));
    }
}